

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::init(RenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  RenderContext *renderCtx;
  int iVar1;
  RenderTarget *pRVar2;
  NotSupportedError *pNVar3;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  ProgramSources *pPVar4;
  TestError *this_02;
  allocator<char> local_259;
  undefined1 local_258 [40];
  undefined1 local_230 [40];
  string local_208;
  GLint maxTexSize;
  string local_1c8;
  undefined1 local_1a8 [176];
  pointer local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar2->m_width;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_renderTargetType == RENDERTARGETTYPE_FBO) {
    maxTexSize = 0;
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0xd33,&maxTexSize);
    if (maxTexSize < 0x100) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_258,"GL_MAX_TEXTURE_SIZE must be at least ",
                 (allocator<char> *)&local_208);
      de::toString<int>((string *)local_230,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_1a8);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if ((this->m_renderTargetType == RENDERTARGETTYPE_SCREEN) &&
          ((iVar1 < 0x100 || (pRVar2->m_height < 0x100)))) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxTexSize,"Render target size must be at least ",&local_259);
    de::toString<int>(&local_208,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxTexSize,
                   &local_208);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "x");
    de::toString<int>(&local_1c8,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   &local_1c8);
    tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_1a8);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Creating test shader.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8 = (pointer)0x0;
  uStack_f0 = 0;
  uStack_ef = 0;
  uStack_e8 = 0;
  uStack_e7 = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&maxTexSize,this);
  glu::VertexSource::VertexSource((VertexSource *)local_258,(string *)&maxTexSize);
  pPVar4 = glu::ProgramSources::operator<<((ProgramSources *)local_1a8,(ShaderSource *)local_258);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&local_208,this);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_230,&local_208);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_230);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar4);
  this->m_program = this_01;
  std::__cxx11::string::~string((string *)(local_230 + 8));
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)(local_258 + 8));
  std::__cxx11::string::~string((string *)&maxTexSize);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1a8);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    return (int)this->m_program;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"shader compile failed",(allocator<char> *)local_258);
  tcu::TestError::TestError(this_02,(string *)local_1a8);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderCase::init (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	// check target size
	if (m_renderTargetType == RENDERTARGETTYPE_SCREEN)
	{
		if (width < TEST_CANVAS_SIZE || height < TEST_CANVAS_SIZE)
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(TEST_CANVAS_SIZE) + "x" + de::toString(TEST_CANVAS_SIZE));
	}
	else if (m_renderTargetType == RENDERTARGETTYPE_FBO)
	{
		GLint maxTexSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);

		if (maxTexSize < TEST_CANVAS_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_CANVAS_SIZE));
	}
	else
		DE_ASSERT(false);

	// gen shader

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shader." << tcu::TestLog::EndMessage;

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource()) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("shader compile failed");
}